

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxLoopStatement::Backpatch
          (FxLoopStatement *this,VMFunctionBuilder *build,size_t loopstart,size_t loopend)

{
  FxJumpStatement *pFVar1;
  size_t target;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->Jumps).Count; uVar2 = uVar2 + 1) {
    pFVar1 = (this->Jumps).Array[uVar2];
    target = loopstart;
    if (pFVar1->Token == 0x126) {
      target = loopend;
    }
    VMFunctionBuilder::Backpatch(build,pFVar1->Address,target);
  }
  return;
}

Assistant:

void FxLoopStatement::Backpatch(VMFunctionBuilder *build, size_t loopstart, size_t loopend)
{
	// Give a proper address to any break/continue statement within this loop.
	for (unsigned int i = 0; i < Jumps.Size(); i++)
	{
		if (Jumps[i]->Token == TK_Break)
		{
			build->Backpatch(Jumps[i]->Address, loopend);
		}
		else
		{ // Continue statement.
			build->Backpatch(Jumps[i]->Address, loopstart);
		}
	}
}